

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O1

bool __thiscall cmCTestHandlerCommand::CheckArgumentValue(cmCTestHandlerCommand *this,string *arg)

{
  int iVar1;
  uint uVar2;
  pointer ppcVar3;
  char *pcVar4;
  cmMakefile *this_00;
  cmCTest *this_01;
  size_t sVar5;
  ostream *poVar6;
  ostringstream e;
  undefined1 auStack_1c8 [8];
  string local_1c0;
  undefined1 local_1a0 [376];
  
  iVar1 = this->ArgumentDoing;
  if (iVar1 == 2) {
    this->ArgumentDoing = 0;
    uVar2 = this->ArgumentIndex;
    ppcVar3 = (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    if (ppcVar3[uVar2] == (char *)0x0) {
      ppcVar3[uVar2] = (arg->_M_dataplus)._M_p;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Set ",4);
      pcVar4 = (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar2];
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)auStack_1c8 + (int)*(_func_int **)(local_1a0._0_8_ + -0x18) + 0x28);
      }
      else {
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar4,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," to ",4);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,(arg->_M_dataplus)._M_p,arg->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      this_01 = (this->super_cmCTestCommand).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_01,0,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                   ,0x124,local_1c0._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"Called with more than one value for ",0x24);
      pcVar4 = (this->Arguments).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar2];
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)auStack_1c8 + (int)*(_func_int **)(local_1a0._0_8_ + -0x18) + 0x28);
      }
      else {
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar4,sVar5);
      }
      this_00 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      this->ArgumentDoing = 1;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  }
  return iVar1 == 2;
}

Assistant:

bool cmCTestHandlerCommand::CheckArgumentValue(std::string const& arg)
{
  if (this->ArgumentDoing == ArgumentDoingKeyword) {
    this->ArgumentDoing = ArgumentDoingNone;
    unsigned int k = this->ArgumentIndex;
    if (this->Values[k]) {
      std::ostringstream e;
      e << "Called with more than one value for " << this->Arguments[k];
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      this->ArgumentDoing = ArgumentDoingError;
      return true;
    }
    this->Values[k] = arg.c_str();
    cmCTestLog(this->CTest, DEBUG, "Set " << this->Arguments[k] << " to "
                                          << arg << "\n");
    return true;
  }
  return false;
}